

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68020_cpscc(void)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint in_EDI;
  uint uVar5;
  
  if (((byte)g_cpu_type & 0x1c) != 0) {
    uVar2 = dasm_read_imm_16(in_EDI);
    uVar3 = dasm_read_imm_16(in_EDI);
    uVar5 = g_cpu_ir >> 9;
    pcVar1 = g_cpcc[uVar2 & 0x3f];
    pcVar4 = get_ea_mode_str(g_cpu_ir,0);
    sprintf(g_dasm_str,"%ds%-4s  %s; (extension = $%x) (2-3)",(ulong)(uVar5 & 7),pcVar1,pcVar4,
            (ulong)uVar3);
    return;
  }
  if ((~g_cpu_ir & 0xf000) != 0) {
    d68000_illegal();
    return;
  }
  sprintf(g_dasm_str,"dc.w    $%04x; opcode 1111",(ulong)g_cpu_ir);
  return;
}

Assistant:

static void d68020_cpscc(void)
{
	uint extension1;
	uint extension2;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension1 = read_imm_16();
	extension2 = read_imm_16();
	sprintf(g_dasm_str, "%ds%-4s  %s; (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[extension1&0x3f], get_ea_mode_str_8(g_cpu_ir), extension2);
}